

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

string * vkt::tessellation::anon_unknown_1::glslCheckBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar4;
  allocator<char> local_242;
  byte local_241;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  int local_1fc;
  string local_1f8 [4];
  int i;
  ostringstream local_1d8 [8];
  ostringstream result;
  allocator<char> local_49;
  string local_48 [8];
  string indentation;
  int scalarSize;
  int indentationDepth_local;
  DataType type_local;
  string *name_local;
  
  indentation.field_2._12_4_ = glu::getDataTypeScalarSize(type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,(long)indentationDepth,'\t',&local_49)
  ;
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  poVar2 = std::operator<<((ostream *)local_1d8,local_48);
  poVar2 = std::operator<<(poVar2,"allOk = allOk && compare_");
  pcVar3 = glu::getDataTypeName(type);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::operator<<(poVar2,", ");
  uVar4 = extraout_RDX;
  if (type != TYPE_FLOAT) {
    std::__cxx11::string::string(local_1f8);
    poVar2 = std::operator<<((ostream *)local_1d8,local_1f8);
    pcVar3 = glu::getDataTypeName(type);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"(");
    std::__cxx11::string::~string(local_1f8);
    uVar4 = extraout_RDX_00;
  }
  for (local_1fc = 0; local_1fc < (int)indentation.field_2._12_4_; local_1fc = local_1fc + 1) {
    local_241 = 0;
    bVar1 = local_1fc < 1;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"v",&local_242);
    }
    else {
      de::floatToString_abi_cxx11_(&local_240,(de *)0x1,(float)local_1fc * 0.8,(int)uVar4);
      local_241 = 1;
      std::operator+(&local_220,", v+",&local_240);
    }
    std::operator<<((ostream *)local_1d8,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    uVar4 = extraout_RDX_01;
    if (bVar1) {
      std::allocator<char>::~allocator(&local_242);
      uVar4 = extraout_RDX_02;
    }
    if ((local_241 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_240);
      uVar4 = extraout_RDX_03;
    }
  }
  if (type != TYPE_FLOAT) {
    std::operator<<((ostream *)local_1d8,")");
  }
  poVar2 = std::operator<<((ostream *)local_1d8,");\n");
  poVar2 = std::operator<<(poVar2,local_48);
  poVar2 = std::operator<<(poVar2,"v += 0.4;\n");
  poVar2 = std::operator<<(poVar2,local_48);
  std::operator<<(poVar2,"if (allOk) ++firstFailedInputIndex;\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string glslCheckBasicTypeObject (const std::string& name, const glu::DataType type, const int indentationDepth)
{
	const int			scalarSize	= glu::getDataTypeScalarSize(type);
	const std::string	indentation	= std::string(indentationDepth, '\t');
	std::ostringstream	result;

	result << indentation << "allOk = allOk && compare_" << glu::getDataTypeName(type) << "(" << name << ", ";

	if (type != glu::TYPE_FLOAT)
		result << std::string() << glu::getDataTypeName(type) << "(";
	for (int i = 0; i < scalarSize; ++i)
		result << (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1) : "v");
	if (type != glu::TYPE_FLOAT)
		result << ")";
	result << ");\n"
		   << indentation << "v += 0.4;\n"
		   << indentation << "if (allOk) ++firstFailedInputIndex;\n";

	return result.str();
}